

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

void __thiscall Json::FastWriter::~FastWriter(FastWriter *this)

{
  (this->super_Writer)._vptr_Writer = (_func_int **)&PTR__FastWriter_00128a90;
  std::__cxx11::string::~string((string *)&this->document_);
  return;
}

Assistant:

~FastWriter() JSONCPP_OVERRIDE {}